

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::textarea::render_input(textarea *this)

{
  form_context *in_RSI;
  
  render_input((textarea *)
               ((long)&(this->super_base_text)._vptr_base_text +
               (long)(this->super_base_text)._vptr_base_text[-10]),in_RSI);
  return;
}

Assistant:

void textarea::render_input(form_context &context)
{
	std::ostream &output = context.out();

	if(context.widget_part() == first_part)
	{
		output<<"<textarea ";
		render_attributes(context);

		if(rows_ >= 0) {
			output<<"rows=\""<< cint(rows_) << "\" ";
		}

		if(cols_ >= 0) {
			output<<"cols=\"" <<cint(cols_) << "\" ";
		}
	}
	else {
		if(set()) {
			output << ">"<<util::escape(value())<<"</textarea>";
		}
		else {
			output << "></textarea>";
		}
	}
}